

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::
GeneratedMessageTest_TestSwapNameIsNotMangledForFields_Test::TestBody
          (GeneratedMessageTest_TestSwapNameIsNotMangledForFields_Test *this)

{
  int32_t iVar1;
  TestConflictingSymbolNames_BadKnownNamesValues local_88;
  TestConflictingSymbolNames_BadKnownNamesFields local_48;
  int32_t local_14;
  GeneratedMessageTest_TestSwapNameIsNotMangledForFields_Test *pGStack_10;
  int v;
  GeneratedMessageTest_TestSwapNameIsNotMangledForFields_Test *this_local;
  
  pGStack_10 = this;
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesFields::
  TestConflictingSymbolNames_BadKnownNamesFields(&local_48);
  iVar1 = proto2_unittest::TestConflictingSymbolNames_BadKnownNamesFields::swap(&local_48);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesFields::
  ~TestConflictingSymbolNames_BadKnownNamesFields(&local_48);
  local_14 = iVar1;
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  TestConflictingSymbolNames_BadKnownNamesValues(&local_88);
  local_14 = proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
             GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
                       (&local_88,
                        (ExtensionIdentifier<proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
                         *)&proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::swap_);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  ~TestConflictingSymbolNames_BadKnownNamesValues(&local_88);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestSwapNameIsNotMangledForFields) {
  // For backwards compatibility we do not mangle `swap`. It works thanks to
  // overload resolution.
  int v [[maybe_unused]] =
      proto2_unittest::TestConflictingSymbolNames::BadKnownNamesFields().swap();

  // But we do mangle `swap` for extensions because there is no overloading
  // there.
  v = proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::TestConflictingSymbolNames::
                            BadKnownNamesValues::swap_);
}